

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# natpmp.cpp
# Opt level: O2

void __thiscall libtorrent::natpmp::on_reply(natpmp *this,error_code *e,size_t bytes_transferred)

{
  endpoint *this_00;
  deadline_timer *this_01;
  pointer pmVar1;
  ushort uVar2;
  size_t sVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  socket *psVar9;
  undefined4 extraout_var;
  time_point tVar10;
  char *pcVar11;
  ulong uVar12;
  address *paVar13;
  endpoint *ep;
  address *addr;
  natpmp *pnVar14;
  string *this_02;
  portmap_callback *ppVar15;
  char *pcVar16;
  _func_int **pp_Var17;
  port_mapping_t i;
  long lVar18;
  portmap_protocol pVar19;
  pointer pmVar20;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 uVar21;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 uVar22;
  undefined4 extraout_XMM0_Db_06;
  ulong uVar23;
  char *local_5d8;
  socket *local_5d0;
  natpmp *local_5c8;
  size_t local_5c0;
  address external_addr;
  array<char,_12UL> nonce;
  long local_578;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_570;
  undefined8 local_568;
  unsigned_long uStack_560;
  error_code local_558;
  char msg [200];
  array<char,_1100UL> msg_buf;
  
  if (e->failed_ == true) {
    iVar5 = (*this->m_callback->_vptr_portmap_callback[1])(this->m_callback,0);
    if ((char)iVar5 == '\0') {
      return;
    }
    (*e->cat_->_vptr_error_category[4])(&msg_buf,e->cat_,(ulong)(uint)e->val_);
    log(this,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    this_02 = (string *)&msg_buf;
    goto LAB_00217ee7;
  }
  if (this->m_abort != false) {
    return;
  }
  local_5c0 = bytes_transferred;
  memcpy(&msg_buf,this->m_response_buffer,bytes_transferred);
  external_addr.ipv6_address_.addr_.__in6_u._0_8_ = 0x44c;
  this_00 = &this->m_remote;
  external_addr._0_8_ = this->m_response_buffer;
  ::std::__shared_ptr<libtorrent::natpmp,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libtorrent::natpmp,void>
            ((__shared_ptr<libtorrent::natpmp,(__gnu_cxx::_Lock_policy)2> *)&local_578,
             (__weak_ptr<libtorrent::natpmp,_(__gnu_cxx::_Lock_policy)2> *)this);
  msg._0_8_ = on_reply;
  msg[8] = '\0';
  msg[9] = '\0';
  msg[10] = '\0';
  msg[0xb] = '\0';
  msg[0xc] = '\0';
  msg[0xd] = '\0';
  msg[0xe] = '\0';
  msg[0xf] = '\0';
  msg[0x10] = (undefined1)local_578;
  msg[0x11] = local_578._1_1_;
  msg[0x12] = local_578._2_1_;
  msg[0x13] = local_578._3_1_;
  msg[0x14] = local_578._4_1_;
  msg[0x15] = local_578._5_1_;
  msg[0x16] = local_578._6_1_;
  msg[0x17] = local_578._7_1_;
  msg._24_8_ = _Stack_570._M_pi;
  local_578 = 0;
  _Stack_570._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_5d0 = &this->m_socket;
  boost::asio::
  basic_datagram_socket<boost::asio::ip::udp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
  ::
  async_receive_from<boost::asio::mutable_buffer,std::_Bind<void(libtorrent::natpmp::*(std::shared_ptr<libtorrent::natpmp>,std::_Placeholder<1>,std::_Placeholder<2>))(boost::system::error_code_const&,unsigned_long)>>
            ((basic_datagram_socket<boost::asio::ip::udp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
              *)&this->m_socket,(mutable_buffer *)&external_addr,this_00,
             (_Bind<void_(libtorrent::natpmp::*(std::shared_ptr<libtorrent::natpmp>,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_boost::system::error_code_&,_unsigned_long)>
              *)msg);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(msg + 0x18));
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_570);
  bVar4 = boost::asio::ip::operator!=(this_00,&this->m_nat_endpoint);
  if (bVar4) {
    iVar5 = (*this->m_callback->_vptr_portmap_callback[1])(this->m_callback,0);
    if ((char)iVar5 == '\0') {
      return;
    }
    aux::print_endpoint_abi_cxx11_((string *)msg,(aux *)this_00,ep);
    log(this,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
LAB_00217edf:
    this_02 = (string *)msg;
LAB_00217ee7:
    ::std::__cxx11::string::~string(this_02);
    return;
  }
  this_01 = &this->m_send_timer;
  boost::asio::
  basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::cancel(this_01);
  sVar3 = local_5c0;
  uVar21 = extraout_XMM0_Da_01;
  uVar22 = extraout_XMM0_Db_01;
  if ((local_5c0 < 4) ||
     (local_5d8 = msg_buf._M_elems + 1, local_5c8 = this, (msg_buf._M_elems[0] & 0xfdU) != 0))
  goto LAB_00217f40;
  local_5d8 = msg_buf._M_elems + 4;
  if (msg_buf._M_elems[0] == '\x02') {
    uVar7 = (uint)(byte)msg_buf._M_elems[3];
  }
  else {
    uVar7 = (uint)(ushort)(msg_buf._M_elems._2_2_ << 8 | (ushort)msg_buf._M_elems._2_2_ >> 8);
  }
  if (uVar7 == 1) {
    log(this,(double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
    external_addr._0_8_ = external_addr._0_8_ & 0xffffff0000000000;
    external_addr.ipv6_address_.addr_.__in6_u._0_8_ =
         &boost::system::detail::cat_holder<void>::system_category_instance;
    if (this->m_version != version_pcp) {
      return;
    }
    boost::asio::
    basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::local_endpoint((endpoint_type *)msg,
                     (basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                      *)local_5d0,(error_code *)&external_addr);
    if (msg._0_2_ != 2) {
      return;
    }
    this->m_version = version_natpmp;
    resend_request(this,(port_mapping_t)(this->m_currently_mapping).m_val);
    send_get_ip_address_request(this);
    return;
  }
  if ((local_5c0 < 0xc && msg_buf._M_elems[0] == '\0') ||
     (local_5c0 < 0x18 && msg_buf._M_elems[0] == '\x02')) goto LAB_00217f40;
  psVar9 = (socket *)0x0;
  if (msg_buf._M_elems[0] == '\x02') {
    uVar6 = aux::read_impl<unsigned_int,char*>(&local_5d8);
    psVar9 = (socket *)CONCAT44(extraout_var,uVar6);
  }
  local_5d0 = psVar9;
  aux::read_impl<unsigned_int,char*>(&local_5d8);
  if (msg_buf._M_elems[0] == '\x02') {
    local_5d8 = local_5d8 + 0xc;
  }
  else if (msg_buf._M_elems[1] == -0x80 && msg_buf._M_elems[0] == '\0') {
    uVar7 = aux::read_impl<unsigned_int,char*>(&local_5d8);
    pnVar14 = local_5c8;
    (local_5c8->m_external_ip).type_ = ipv4;
    (local_5c8->m_external_ip).ipv4_address_.addr_.s_addr =
         uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
    (local_5c8->m_external_ip).ipv6_address_.scope_id_ = 0;
    *(undefined8 *)&(local_5c8->m_external_ip).ipv6_address_.addr_.__in6_u = 0;
    *(undefined8 *)((long)&(local_5c8->m_external_ip).ipv6_address_.addr_.__in6_u + 8) = 0;
    iVar5 = (*local_5c8->m_callback->_vptr_portmap_callback[1])(local_5c8->m_callback,0);
    if ((char)iVar5 == '\0') {
      return;
    }
    aux::print_address_abi_cxx11_((string *)msg,(aux *)&pnVar14->m_external_ip,addr);
    log(pnVar14,(double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03));
    goto LAB_00217edf;
  }
  uVar6 = (uint)(byte)msg_buf._M_elems[0];
  this = local_5c8;
  uVar21 = extraout_XMM0_Da_02;
  uVar22 = extraout_XMM0_Db_02;
  if ((sVar3 != 0x10 && msg_buf._M_elems[0] == '\0') ||
     (sVar3 != 0x3c && msg_buf._M_elems[0] == '\x02')) {
LAB_00217f40:
    log(this,(double)CONCAT44(uVar22,uVar21));
    return;
  }
  if (msg_buf._M_elems[0] == '\x02') {
    nonce._M_elems._8_4_ = *(undefined4 *)(local_5d8 + 8);
    nonce._M_elems._0_8_ = *(undefined8 *)local_5d8;
    pVar19 = udp - (local_5d8[0xc] == '\x06');
    local_5d8 = local_5d8 + 0x10;
  }
  else {
    pVar19 = none;
  }
  local_5c0 = CONCAT44(local_5c0._4_4_,(uint)CONCAT11(*local_5d8,local_5d8[1]));
  pcVar11 = local_5d8 + 2;
  pcVar16 = local_5d8 + 3;
  local_5d8 = local_5d8 + 4;
  uVar2 = CONCAT11(*pcVar11,*pcVar16);
  uVar23 = (ulong)uVar2;
  if (uVar6 == 0) {
    uVar8 = aux::read_impl<unsigned_int,char*>(&local_5d8);
    local_5d0 = (socket *)(ulong)uVar8;
    external_addr.ipv6_address_.addr_.__in6_u._8_8_ = 0;
    external_addr.ipv6_address_.scope_id_ = 0;
    external_addr.type_ = ipv4;
    external_addr.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
    external_addr.ipv6_address_.addr_.__in6_u._0_8_ = 0;
    pcVar11 = "NAT-PMP";
  }
  else {
    external_addr.ipv6_address_.addr_.__in6_u._8_8_ = 0;
    external_addr.ipv6_address_.scope_id_ = 0;
    external_addr.type_ = ipv4;
    external_addr.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
    external_addr.ipv6_address_.addr_.__in6_u._0_8_ = 0;
    pcVar11 = "PCP";
    if (msg_buf._M_elems[0] == '\x02') {
      aux::read_v6_address<char*&>(&local_5d8);
      external_addr.type_ = ipv6;
      external_addr.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
      external_addr.ipv6_address_.addr_.__in6_u._0_1_ = msg[0];
      external_addr.ipv6_address_.addr_.__in6_u._1_1_ = msg[1];
      external_addr.ipv6_address_.addr_.__in6_u._2_1_ = msg[2];
      external_addr.ipv6_address_.addr_.__in6_u._3_1_ = msg[3];
      external_addr.ipv6_address_.addr_.__in6_u._4_1_ = msg[4];
      external_addr.ipv6_address_.addr_.__in6_u._5_1_ = msg[5];
      external_addr.ipv6_address_.addr_.__in6_u._6_1_ = msg[6];
      external_addr.ipv6_address_.addr_.__in6_u._7_1_ = msg[7];
      external_addr.ipv6_address_.addr_.__in6_u._8_1_ = msg[8];
      external_addr.ipv6_address_.addr_.__in6_u._9_1_ = msg[9];
      external_addr.ipv6_address_.addr_.__in6_u._10_1_ = msg[10];
      external_addr.ipv6_address_.addr_.__in6_u._11_1_ = msg[0xb];
      external_addr.ipv6_address_.addr_.__in6_u._12_1_ = msg[0xc];
      external_addr.ipv6_address_.addr_.__in6_u._13_1_ = msg[0xd];
      external_addr.ipv6_address_.addr_.__in6_u._14_1_ = msg[0xe];
      external_addr.ipv6_address_.addr_.__in6_u._15_1_ = msg[0xf];
      external_addr.ipv6_address_.scope_id_._0_1_ = msg[0x10];
      external_addr.ipv6_address_.scope_id_._1_1_ = msg[0x11];
      external_addr.ipv6_address_.scope_id_._2_1_ = msg[0x12];
      external_addr.ipv6_address_.scope_id_._3_1_ = msg[0x13];
      external_addr.ipv6_address_.scope_id_._4_1_ = msg[0x14];
      external_addr.ipv6_address_.scope_id_._5_1_ = msg[0x15];
      external_addr.ipv6_address_.scope_id_._6_1_ = msg[0x16];
      external_addr.ipv6_address_.scope_id_._7_1_ = msg[0x17];
      boost::asio::ip::address::to_v6((address_v6 *)msg,&external_addr);
      bVar4 = boost::asio::ip::address_v6::is_v4_mapped((address_v6 *)msg);
      if (bVar4) {
        boost::asio::ip::address::to_v6((address_v6 *)msg,&external_addr);
        boost::asio::ip::make_address_v4((ip *)&local_578,v4_mapped,(address_v6 *)msg);
        external_addr._0_8_ = local_578 << 0x20;
        external_addr.ipv6_address_.addr_.__in6_u._0_8_ = 0;
        external_addr.ipv6_address_.addr_.__in6_u._8_8_ = 0;
        external_addr.ipv6_address_.scope_id_ = 0;
      }
      pcVar11 = "PCP";
    }
  }
  if (uVar6 == 0) {
    pVar19 = udp - (msg_buf._M_elems[1] != -0x7f || msg_buf._M_elems[0] == '\x02');
  }
  pcVar16 = "tcp";
  if (pVar19 == udp) {
    pcVar16 = "udp";
  }
  iVar5 = snprintf(msg,200,
                   "<== port map [ transport: %s protocol: %s local: %d external: %d ttl: %d ]",
                   pcVar11,pcVar16,local_5c0 & 0xffffffff,uVar23,local_5d0);
  pmVar20 = (local_5c8->m_mappings).
            super_vector<libtorrent::natpmp::mapping_t,_std::allocator<libtorrent::natpmp::mapping_t>_>
            .
            super__Vector_base<libtorrent::natpmp::mapping_t,_std::allocator<libtorrent::natpmp::mapping_t>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pmVar1 = (local_5c8->m_mappings).
           super_vector<libtorrent::natpmp::mapping_t,_std::allocator<libtorrent::natpmp::mapping_t>_>
           .
           super__Vector_base<libtorrent::natpmp::mapping_t,_std::allocator<libtorrent::natpmp::mapping_t>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar18 = -(long)pmVar20;
  uVar21 = extraout_XMM0_Da_04;
  uVar22 = extraout_XMM0_Db_04;
  while( true ) {
    if (pmVar20 == pmVar1) {
      snprintf(msg + iVar5,200 - (long)iVar5," not found in map table");
      log(local_5c8,(double)CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06));
      return;
    }
    if ((((pmVar20->local_port == (int)local_5c0) &&
         (pVar19 == (pmVar20->super_base_mapping).protocol)) && (pmVar20->map_sent == true)) &&
       ((pmVar20->outstanding_request == true &&
        ((msg_buf._M_elems[0] != '\x02' ||
         (bVar4 = ::std::operator!=(&nonce,(array<char,_12UL> *)
                                           &(pmVar20->super_base_mapping).field_0x11),
         uVar21 = extraout_XMM0_Da_05, uVar22 = extraout_XMM0_Db_05, !bVar4)))))) break;
    pmVar20 = pmVar20 + 1;
    lVar18 = lVar18 + -0x48;
  }
  local_5c0 = -((long)&(((local_5c8->m_mappings).
                         super_vector<libtorrent::natpmp::mapping_t,_std::allocator<libtorrent::natpmp::mapping_t>_>
                         .
                         super__Vector_base<libtorrent::natpmp::mapping_t,_std::allocator<libtorrent::natpmp::mapping_t>_>
                         ._M_impl.super__Vector_impl_data._M_start)->super_base_mapping).expires.__d
                       .__r + lVar18) / 0x48;
  pmVar20->outstanding_request = false;
  log(local_5c8,(double)CONCAT44(uVar22,uVar21));
  iVar5 = (int)local_5d0;
  if (uVar2 == 0 || iVar5 == 0) {
    (pmVar20->super_base_mapping).protocol = none;
  }
  else {
    tVar10 = aux::time_now();
    (pmVar20->super_base_mapping).expires.__d.__r =
         (long)((iVar5 * 3) / 4) * 1000000000 + (long)tVar10.__d.__r;
    (pmVar20->super_base_mapping).external_port = (uint)uVar2;
    bVar4 = boost::asio::ip::address::is_unspecified(&external_addr);
    if (!bVar4) {
      (pmVar20->external_address).type_ = external_addr.type_;
      (pmVar20->external_address).ipv4_address_ =
           (address_v4)external_addr.ipv4_address_.addr_.s_addr;
      *(undefined8 *)&(pmVar20->external_address).ipv6_address_.addr_.__in6_u =
           external_addr.ipv6_address_.addr_.__in6_u._0_8_;
      *(undefined8 *)((long)&(pmVar20->external_address).ipv6_address_.addr_.__in6_u + 8) =
           external_addr.ipv6_address_.addr_.__in6_u._8_8_;
      (pmVar20->external_address).ipv6_address_.scope_id_ = external_addr.ipv6_address_.scope_id_;
    }
  }
  pnVar14 = local_5c8;
  if (uVar7 == 0) {
    i.m_val = (int)local_5c0;
    if ((pmVar20->super_base_mapping).act != add) goto LAB_00218545;
    local_5d0 = (socket *)CONCAT44(local_5d0._4_4_,(uint)(pmVar20->super_base_mapping).protocol);
    paVar13 = &local_5c8->m_external_ip;
    if (msg_buf._M_elems[0] == '\x02') {
      paVar13 = &pmVar20->external_address;
    }
    local_578._0_4_ = paVar13->type_;
    local_578._4_4_ = paVar13->ipv4_address_;
    _Stack_570._M_pi =
         *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(paVar13->ipv6_address_).addr_.__in6_u;
    local_568 = *(undefined8 *)((long)&(paVar13->ipv6_address_).addr_.__in6_u + 8);
    uStack_560 = (paVar13->ipv6_address_).scope_id_;
    ppVar15 = local_5c8->m_callback;
    uVar7 = (pmVar20->super_base_mapping).external_port;
    local_558 = errors::make_error_code(pcp_success);
    pp_Var17 = ppVar15->_vptr_portmap_callback;
    uVar12 = (ulong)uVar7;
    uVar23 = 0;
  }
  else {
    tVar10 = aux::time_now();
    pnVar14 = local_5c8;
    (pmVar20->super_base_mapping).expires.__d.__r = (long)tVar10.__d.__r + 7200000000000;
    local_5d0 = (socket *)CONCAT44(local_5d0._4_4_,(uint)(pmVar20->super_base_mapping).protocol);
    ppVar15 = local_5c8->m_callback;
    local_568 = 0;
    uStack_560 = 0;
    local_578 = 0;
    _Stack_570._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_558 = from_result_code(uVar6,uVar7);
    pp_Var17 = ppVar15->_vptr_portmap_callback;
    uVar23 = uVar23 & 0xffffffff00000000;
    uVar12 = 0;
  }
  i.m_val = (int)local_5c0;
  (**pp_Var17)(ppVar15,local_5c0 & 0xffffffff,&local_578,uVar12,(ulong)(uint)local_5d0,&local_558,
               uVar23,&pnVar14->m_listen_handle);
LAB_00218545:
  (pnVar14->m_currently_mapping).m_val = -1;
  (pmVar20->super_base_mapping).act = none;
  boost::asio::
  basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::cancel(this_01);
  update_expiration_timer(pnVar14);
  try_next_mapping(pnVar14,i);
  return;
}

Assistant:

void natpmp::on_reply(error_code const& e
	, std::size_t const bytes_transferred)
{
	TORRENT_ASSERT(is_single_thread());

	COMPLETE_ASYNC("natpmp::on_reply");

	using namespace libtorrent::aux;
	if (e)
	{
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			log("error on receiving reply: %s"
				, e.message().c_str());
		}
#endif
		return;
	}

	if (m_abort) return;

	ADD_OUTSTANDING_ASYNC("natpmp::on_reply");
	// make a copy of the response packet buffer
	// to avoid overwriting it in the next receive call
	std::array<char, sizeof(m_response_buffer)> msg_buf;
	std::memcpy(msg_buf.data(), m_response_buffer, bytes_transferred);

	m_socket.async_receive_from(boost::asio::buffer(&m_response_buffer[0]
		, sizeof(m_response_buffer))
		, m_remote, std::bind(&natpmp::on_reply, self(), _1, _2));

	if (m_remote != m_nat_endpoint)
	{
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			log("received packet from wrong IP: %s"
				, print_endpoint(m_remote).c_str());
		}
#endif
		return;
	}

	m_send_timer.cancel();

	if (bytes_transferred < 4)
	{
#ifndef TORRENT_DISABLE_LOGGING
		log("received packet of invalid size: %d", int(bytes_transferred));
#endif
		return;
	}

	char* in = msg_buf.data();
	int const version = read_uint8(in);

	if (version != version_natpmp && version != version_pcp)
	{
#ifndef TORRENT_DISABLE_LOGGING
		log("unexpected version: %u", version);
#endif
		return;
	}

	std::uint8_t cmd = read_uint8(in);
	if (version == version_pcp)
	{
		cmd &= 0x7fu;
	}
	int result;
	if (version == version_pcp)
	{
		++in; // reserved
		result = read_uint8(in);
	}
	else
	{
		result = read_uint16(in);
	}

	if (result == errors::pcp_unsupp_version)
	{
#ifndef TORRENT_DISABLE_LOGGING
		log("unsupported version");
#endif
		// ignore errors from local_endpoint
		error_code ec;
		if (m_version == version_pcp && !aux::is_v6(m_socket.local_endpoint(ec)))
		{
			m_version = version_natpmp;
			resend_request(m_currently_mapping);
			send_get_ip_address_request();
		}
		return;
	}

	if ((version == version_natpmp && bytes_transferred < 12)
		|| (version == version_pcp && bytes_transferred < 24))
	{
#ifndef TORRENT_DISABLE_LOGGING
		log("received packet of invalid size: %d", int(bytes_transferred));
#endif
		return;
	}

	int lifetime = 0;
	if (version == version_pcp)
	{
		lifetime = aux::numeric_cast<int>(read_uint32(in));
	}
	int const time = aux::numeric_cast<int>(read_uint32(in));
	if (version == version_pcp) in += 12; // reserved
	TORRENT_UNUSED(time);

	if (version == version_natpmp && cmd == 0x80)
	{
		// public IP request response
		m_external_ip = read_v4_address(in);

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			log("<== public IP address [ %s ]", print_address(m_external_ip).c_str());
		}
#endif
		return;

	}

	if ((version == version_natpmp && bytes_transferred != 16)
		|| (version == version_pcp && bytes_transferred != 60))
	{
#ifndef TORRENT_DISABLE_LOGGING
		log("received packet of invalid size: %d", int(bytes_transferred));
#endif
		return;
	}

	std::array<char, 12> nonce;
	portmap_protocol protocol = portmap_protocol::none;
	if (version == version_pcp)
	{
		std::memcpy(nonce.data(), in, nonce.size());
		in += nonce.size();
		int p = read_uint8(in);
		protocol = p == 6 ? portmap_protocol::tcp
			: portmap_protocol::udp;
		in += 3; // reserved
	}
	int const private_port = read_uint16(in);
	int const public_port = read_uint16(in);
	if (version == version_natpmp)
		lifetime = aux::numeric_cast<int>(read_uint32(in));
	address external_addr;
	if (version == version_pcp)
	{
		external_addr = read_v6_address(in);
		if (external_addr.to_v6().is_v4_mapped())
			external_addr = make_address_v4(v4_mapped, external_addr.to_v6());
	}

	if (version == version_natpmp)
	{
		protocol = (cmd - 128 == 1)
			? portmap_protocol::udp
			: portmap_protocol::tcp;
	}

#ifndef TORRENT_DISABLE_LOGGING
	char msg[200];
	int const num_chars = std::snprintf(msg, sizeof(msg), "<== port map ["
		" transport: %s protocol: %s local: %d external: %d ttl: %d ]"
		, version_to_string(protocol_version(version))
		, (protocol == portmap_protocol::udp ? "udp" : "tcp")
		, private_port, public_port, lifetime);
#endif

	mapping_t* m = nullptr;
	port_mapping_t index{-1};
	for (auto i = m_mappings.begin(), end(m_mappings.end()); i != end; ++i)
	{
		if (private_port != i->local_port) continue;
		if (protocol != i->protocol) continue;
		if (!i->map_sent) continue;
		if (!i->outstanding_request) continue;
		if (version == version_pcp && nonce != i->nonce) continue;
		m = &*i;
		index = port_mapping_t(static_cast<int>(i - m_mappings.begin()));
		break;
	}

	if (m == nullptr)
	{
#ifndef TORRENT_DISABLE_LOGGING
		snprintf(msg + num_chars, sizeof(msg) - aux::numeric_cast<std::size_t>(num_chars), " not found in map table");
		log("%s", msg);
#endif
		return;
	}
	m->outstanding_request = false;

#ifndef TORRENT_DISABLE_LOGGING
	log("%s", msg);
#endif

	if (public_port == 0 || lifetime == 0)
	{
		// this means the mapping was
		// successfully closed
		m->protocol = portmap_protocol::none;
	}
	else
	{
		m->expires = aux::time_now() + seconds(lifetime * 3 / 4);
		m->external_port = public_port;
		if (!external_addr.is_unspecified())
			m->external_address = external_addr;
	}

	if (result != 0)
	{
		m->expires = aux::time_now() + hours(2);
		portmap_protocol const proto = m->protocol;
		m_callback.on_port_mapping(port_mapping_t{index}, address(), 0, proto
			, from_result_code(version, result), portmap_transport::natpmp, m_listen_handle);
	}
	else if (m->act == portmap_action::add)
	{
		portmap_protocol const proto = m->protocol;
		address const ext_ip = version == version_pcp ? m->external_address : m_external_ip;
		m_callback.on_port_mapping(port_mapping_t{index}, ext_ip, m->external_port, proto
			, errors::pcp_success, portmap_transport::natpmp, m_listen_handle);
	}

	m_currently_mapping = port_mapping_t{-1};
	m->act = portmap_action::none;
	m_send_timer.cancel();
	update_expiration_timer();
	try_next_mapping(index);
}